

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ColoredPrintf(GTestColor color,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &args[0].overflow_arg_area;
  local_f8 = 0x3000000010;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (ColoredPrintf(testing::internal::(anonymous_namespace)::GTestColor,char_const*,...)::
      in_color_mode == '\0') {
    iVar1 = __cxa_guard_acquire(&ColoredPrintf(testing::internal::(anonymous_namespace)::GTestColor,char_const*,...)
                                 ::in_color_mode);
    if (iVar1 != 0) {
      iVar2 = fileno(_stdout);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      iVar2 = isatty(iVar2);
      *piVar3 = iVar1;
      ColoredPrintf::in_color_mode = ShouldUseColor(iVar2 != 0);
      __cxa_guard_release(&ColoredPrintf(testing::internal::(anonymous_namespace)::GTestColor,char_const*,...)
                           ::in_color_mode);
    }
  }
  if ((color == kDefault) || (ColoredPrintf::in_color_mode == false)) {
    vprintf(fmt,&local_f8);
  }
  else {
    printf("\x1b[0;3%sm",&DAT_00179d08 + *(int *)(&DAT_00179d04 + (long)(int)color * 4));
    vprintf(fmt,&local_f8);
    printf("\x1b[m");
  }
  return;
}

Assistant:

static void ColoredPrintf(GTestColor color, const char* fmt, ...) {
  va_list args;
  va_start(args, fmt);

  static const bool in_color_mode =
      // We don't condition this on GTEST_HAS_FILE_SYSTEM because we still need
      // to be able to detect terminal I/O regardless.
      ShouldUseColor(posix::IsATTY(posix::FileNo(stdout)) != 0);

  const bool use_color = in_color_mode && (color != GTestColor::kDefault);

  if (!use_color) {
    vprintf(fmt, args);
    va_end(args);
    return;
  }

#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MOBILE) &&       \
    !defined(GTEST_OS_WINDOWS_GAMES) && !defined(GTEST_OS_WINDOWS_PHONE) && \
    !defined(GTEST_OS_WINDOWS_RT) && !defined(GTEST_OS_WINDOWS_MINGW)
  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;
  const WORD new_color = GetNewColor(color, old_color_attrs);

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle, new_color);

  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  printf("\033[0;3%sm", GetAnsiColorCode(color));
  vprintf(fmt, args);
  printf("\033[m");  // Resets the terminal to default.
#endif  // GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MOBILE
  va_end(args);
}